

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O3

BasicBlock * anon_unknown.dwarf_23be6::chooseTarget(BasicBlock *Avoid)

{
  SymbolTableList<llvm::BasicBlock> *pSVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ilist_node_base<false> **ppiVar5;
  long lVar6;
  BasicBlock *pBVar7;
  long lVar8;
  undefined1 *puVar9;
  Twine local_80;
  void *pvStack_58;
  vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  targets;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  local_38;
  
  pvStack_58 = (void *)0x0;
  targets.
  super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  targets.
  super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (SymbolTableList<llvm::BasicBlock> *)((anonymous_namespace)::F + 0x48);
  local_38.BB.NodePtr = *(node_pointer *)((anonymous_namespace)::F + 0x50);
  puVar9 = &((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)[-2].field_0x8;
  if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
      (SymbolTableList<llvm::BasicBlock> *)0x0) {
    puVar9 = (undefined1 *)0x0;
  }
  lVar8 = *(long *)(puVar9 + 0x30);
  if (lVar8 == (long)puVar9 + 0x28) {
    do {
      local_38.BB.NodePtr =
           *(node_pointer *)&((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)->field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr == pSVar1) break;
      puVar9 = &((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)[-2].field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
          (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar9 = (undefined1 *)0x0;
      }
      lVar8 = *(long *)(puVar9 + 0x30);
    } while (lVar8 == (long)puVar9 + 0x28);
  }
  local_38.BI.NodePtr = *(node_pointer *)(lVar8 + 8);
  puVar9 = &((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)[-2].field_0x8;
  if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
      (SymbolTableList<llvm::BasicBlock> *)0x0) {
    puVar9 = (undefined1 *)0x0;
  }
  if (&(local_38.BI.NodePtr)->super_node_base_type == (ilist_node_base<false> *)(puVar9 + 0x28)) {
    do {
      local_38.BB.NodePtr =
           *(node_pointer *)&((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)->field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr == pSVar1) break;
      puVar9 = &((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)[-2].field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
          (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar9 = (undefined1 *)0x0;
      }
      local_38.BI.NodePtr = *(node_pointer *)(puVar9 + 0x30);
    } while (&(local_38.BI.NodePtr)->super_node_base_type ==
             (ilist_node_base<false> *)(puVar9 + 0x28));
  }
  local_38.BBs = pSVar1;
  do {
    do {
      if (((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr == pSVar1) &&
         ((pSVar1 == local_38.BBs ||
          (&(local_38.BI.NodePtr)->super_node_base_type == (ilist_node_base<false> *)0x0)))) {
        iVar4 = Choose((int)((ulong)((long)targets.
                                           super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                    (long)pvStack_58) >> 3) * -0x55555555);
        lVar2 = *(long *)((long)pvStack_58 + (long)iVar4 * 0x18 + 0x10);
        lVar8 = lVar2 + -0x18;
        if (lVar2 == 0) {
          lVar8 = 0;
        }
        lVar6 = llvm::BasicBlock::getFirstInsertionPt(*(BasicBlock **)(lVar8 + 0x28));
        bVar3 = lVar2 == 0;
        if (lVar6 != 0) {
          bVar3 = lVar6 + -0x18 == lVar8;
        }
        pBVar7 = *(BasicBlock **)(lVar8 + 0x28);
        if (!bVar3) {
          llvm::Twine::Twine(&local_80,"spl");
          pBVar7 = (BasicBlock *)llvm::BasicBlock::splitBasicBlock(pBVar7,lVar8 + 0x18,&local_80,0);
        }
        if (pvStack_58 != (void *)0x0) {
          operator_delete(pvStack_58,
                          (long)targets.
                                super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
        }
        return pBVar7;
      }
      ppiVar5 = &local_38.BI.NodePtr[-2].super_node_base_type.Next;
      if (&(local_38.BI.NodePtr)->super_node_base_type == (ilist_node_base<false> *)0x0) {
        ppiVar5 = (ilist_node_base<false> **)0x0;
      }
      if (10 < *(byte *)(ppiVar5 + 2) - 0x1c) {
        if (targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>,std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>>>
          ::
          _M_realloc_insert<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>const&>
                    ((vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>,std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>>>
                      *)&pvStack_58,
                     (iterator)
                     targets.
                     super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&local_38);
        }
        else {
          ((targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->BI).NodePtr = local_38.BI.NodePtr;
          (targets.
           super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->BBs = local_38.BBs;
          ((targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->BB).NodePtr = local_38.BB.NodePtr;
          targets.
          super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               targets.
               super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      local_38.BI.NodePtr = (node_pointer)((local_38.BI.NodePtr)->super_node_base_type).Next;
      puVar9 = &((SymbolTableList<llvm::BasicBlock> *)(local_38.BB.NodePtr + -2))->field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
          (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar9 = (undefined1 *)0x0;
      }
    } while ((ilist_node_base<false> *)local_38.BI.NodePtr !=
             (ilist_node_base<false> *)(puVar9 + 0x28));
    do {
      local_38.BB.NodePtr =
           *(node_pointer *)&((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)->field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr == local_38.BBs) break;
      puVar9 = &((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr)[-2].field_0x8;
      if ((SymbolTableList<llvm::BasicBlock> *)local_38.BB.NodePtr ==
          (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar9 = (undefined1 *)0x0;
      }
      local_38.BI.NodePtr = *(node_pointer *)(puVar9 + 0x30);
    } while (&(local_38.BI.NodePtr)->super_node_base_type ==
             (ilist_node_base<false> *)(puVar9 + 0x28));
  } while( true );
}

Assistant:

BasicBlock *chooseTarget(BasicBlock *Avoid = 0) {
  std::vector<inst_iterator> targets;
  auto i = inst_begin(F), ie = inst_end(F);
  ++i;
  for (; i != ie; ++i)
    if (!i->isTerminator())
      targets.push_back(i);
  auto t = targets[Choose(targets.size())];
  Instruction *I = &*t;
  BasicBlock *BB;
  if (I == &*I->getParent()->getFirstInsertionPt()) {
    BB = I->getParent();
  } else {
    BB = I->getParent()->splitBasicBlock(I, "spl");
  }
  return BB;
}